

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::CodeHolder::newRelocEntry(CodeHolder *this,RelocEntry **dst,RelocType relocType)

{
  uint32_t uVar1;
  Error EVar2;
  bool bVar3;
  RelocEntry *re;
  
  EVar2 = ZoneVector<asmjit::v1_14::RelocEntry_*>::willGrow(&this->_relocations,&this->_allocator,1)
  ;
  if (EVar2 == 0) {
    uVar1 = *(uint32_t *)&this->field_0x110;
    if (uVar1 == 0xffffffff) {
      EVar2 = 0x16;
    }
    else {
      re = (RelocEntry *)ZoneAllocator::allocZeroed(&this->_allocator,0x28);
      bVar3 = re != (RelocEntry *)0x0;
      if (bVar3) {
        re->_id = uVar1;
        re->_relocType = relocType;
        re->_sourceSectionId = 0xffffffff;
        re->_targetSectionId = 0xffffffff;
        ZoneVector<asmjit::v1_14::RelocEntry_*>::appendUnsafe(&this->_relocations,&re);
        *dst = re;
      }
      EVar2 = (Error)!bVar3;
    }
  }
  return EVar2;
}

Assistant:

Error CodeHolder::newRelocEntry(RelocEntry** dst, RelocType relocType) noexcept {
  ASMJIT_PROPAGATE(_relocations.willGrow(&_allocator));

  uint32_t relocId = _relocations.size();
  if (ASMJIT_UNLIKELY(relocId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManyRelocations);

  RelocEntry* re = _allocator.allocZeroedT<RelocEntry>();
  if (ASMJIT_UNLIKELY(!re))
    return DebugUtils::errored(kErrorOutOfMemory);

  re->_id = relocId;
  re->_relocType = relocType;
  re->_sourceSectionId = Globals::kInvalidId;
  re->_targetSectionId = Globals::kInvalidId;
  _relocations.appendUnsafe(re);

  *dst = re;
  return kErrorOk;
}